

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

void __thiscall Helper::GeneratePermutedVectors(Helper *this,int n_p,int n_d,int count)

{
  ostream *poVar1;
  pointer __n;
  int j;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  pointer this_00;
  int k;
  int iVar5;
  pointer *__a;
  ulong uVar6;
  bool bVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_7d8 [8];
  ifstream fin2;
  string local_5d0 [8];
  ifstream fin1;
  string local_3c8 [8];
  ofstream output_file;
  undefined1 local_1c8 [8];
  vector<int,_std::allocator<int>_> Pi;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  undefined1 local_c8 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  R;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  temp;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  long temp1;
  long temp2;
  int iStack_58;
  uint local_54;
  uint local_50;
  int local_4c;
  _Alloc_hider local_48;
  ulong uStack_40;
  undefined4 local_38;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator_type local_31;
  
  local_54 = n_d;
  local_50 = n_p;
  local_4c = count;
  std::ofstream::ofstream(local_3c8);
  std::ifstream::ifstream(local_5d0);
  std::ifstream::ifstream(local_7d8);
  std::__cxx11::string::string
            ((string *)local_1c8,"../randoms/bob/Pi_diff_R_PA_PB.txt",(allocator *)local_c8);
  std::__cxx11::string::string
            (local_1a8,"../randoms/alice/Pi_diff_R_PB_PA.txt",
             (allocator *)
             &R.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string
            (local_188,"../randoms/bob/Pi_diff_R_DA_DB.txt",
             (allocator *)
             &file_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string(local_168,"../randoms/alice/Pi_diff_R_DB_DA.txt",(allocator *)&temp1)
  ;
  std::__cxx11::string::string(local_148,"../randoms/alice/R_PA.txt",(allocator *)&local_48);
  std::__cxx11::string::string(local_128,"../randoms/bob/R_PB.txt",&local_34);
  std::__cxx11::string::string(local_108,"../randoms/alice/R_DA.txt",&local_33);
  std::__cxx11::string::string(local_e8,"../randoms/bob/R_DB.txt",&local_32);
  __l._M_len = 8;
  __l._M_array = (iterator)local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88,__l,&local_31);
  lVar2 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)(local_1c8 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  uVar4 = 0;
  while (uVar4 != 4) {
    std::ofstream::open(local_3c8,(int)(uVar4 << 5) + local_88._0_4_);
    local_38 = local_54;
    if (uVar4 < 2) {
      local_38 = local_50;
    }
    temp2 = uVar4;
    std::ifstream::open(local_5d0,local_88._0_4_ + 0x80);
    this_00 = (pointer)((long)local_88 + 0xa0);
    std::ifstream::open(local_7d8,(_Ios_Openmode)this_00);
    __n = (pointer)(long)(int)local_38;
    uStack_40 = 0;
    if (0 < (int)local_38) {
      uStack_40 = (ulong)(uint)local_38;
    }
    uVar4 = (ulong)(uVar4 < 2) * 3 + 2;
    iStack_58 = local_4c;
    while( true ) {
      __a = &R.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      bVar7 = iStack_58 == 0;
      iStack_58 = iStack_58 + -1;
      if (bVar7) break;
      LoadNextRandomPermutation
                ((vector<int,_std::allocator<int>_> *)local_1c8,(Helper *)this_00,(int)temp2,
                 local_38);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)local_c8,(size_type)__n,(allocator_type *)__a);
      this_00 = __n;
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)__a,(size_type)__n,(allocator_type *)&local_48);
      for (uVar3 = 0; uVar6 = uVar4, uVar3 != uStack_40; uVar3 = uVar3 + 1) {
        while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
          std::istream::_M_extract<long>((long *)local_5d0);
          std::istream::_M_extract<long>((long *)local_7d8);
          local_48._M_p =
               (pointer)((long)file_name.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - temp1);
          this_00 = (pointer)&local_48;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    (R.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + uVar3,(long *)this_00);
        }
      }
      for (uVar3 = 0; uVar3 != uStack_40; uVar3 = uVar3 + 1) {
        for (uVar6 = 0; (uint)((int)uVar4 * 8) != uVar6; uVar6 = uVar6 + 8) {
          this_00 = (pointer)((long)R.
                                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar3].
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start + uVar6);
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)
                     ((long)local_c8 + (long)*(int *)((long)local_1c8 + uVar3 * 4) * 0x18),
                     (value_type_conflict2 *)this_00);
        }
      }
      for (uVar3 = 0; uVar3 != uStack_40; uVar3 = uVar3 + 1) {
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          poVar1 = std::ostream::_M_insert<long>((long)local_3c8);
          this_00 = (pointer)0x105300;
          std::operator<<(poVar1," ");
        }
        std::endl<char,std::char_traits<char>>((ostream *)local_3c8);
      }
      std::endl<char,std::char_traits<char>>((ostream *)local_3c8);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)&R.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_c8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_1c8);
    }
    std::ifstream::close();
    std::ifstream::close();
    std::ostream::flush();
    std::ofstream::close();
    uVar4 = temp2 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::ifstream::~ifstream(local_7d8);
  std::ifstream::~ifstream(local_5d0);
  std::ofstream::~ofstream(local_3c8);
  return;
}

Assistant:

void Helper::GeneratePermutedVectors(int n_p, int n_d, int count)
{
    std::ofstream output_file;
    std::ifstream fin1, fin2;
    std::vector<std::string> file_name = {"../randoms/bob/Pi_diff_R_PA_PB.txt", "../randoms/alice/Pi_diff_R_PB_PA.txt",
                                          "../randoms/bob/Pi_diff_R_DA_DB.txt", "../randoms/alice/Pi_diff_R_DB_DA.txt",
                                          "../randoms/alice/R_PA.txt", "../randoms/bob/R_PB.txt", "../randoms/alice/R_DA.txt", "../randoms/bob/R_DB.txt"};
    for (int i = 0; i < 4; i++)
    {
        output_file.open(file_name[i]);
        int n = (i < 2 ? n_p : n_d);
        int m = (i < 2 ? 5 : 2);
        switch (i)
        {
        case 0:
            fin1.open(file_name[4]);
            fin2.open(file_name[5]);
            break;
        case 1:
            fin1.open(file_name[5]);
            fin2.open(file_name[4]);
            break;
        case 2:
            fin1.open(file_name[6]);
            fin2.open(file_name[7]);
            break;
        case 3:
            fin1.open(file_name[7]);
            fin2.open(file_name[6]);
            break;
        default:
            break;
        }

        int l = count;
        long temp1, temp2;
        while (l--)
        {
            std::vector<int> Pi = LoadNextRandomPermutation(i, n);
            std::vector<std::vector<long>> R(n),temp(n);
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                    fin1 >> temp1;
                    fin2 >> temp2;
                    temp[j].push_back(temp1-temp2);
                }
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                    R[Pi[j]].push_back(temp[j][k]);
                    
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                   output_file<<R[j][k]<<" "; 
                }
                output_file<<std::endl;
            }
            output_file<<std::endl;
        }
        fin1.close();
        fin2.close();
        output_file.flush();
        output_file.close();
    }
}